

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles31::Functional::createSeparateShaderTests(Context *ctx)

{
  TestParams params;
  undefined1 auVar1 [20];
  TestParams params_00;
  TestParams params_01;
  int iVar2;
  deUint32 dVar3;
  TestCaseGroup *pTVar4;
  SeparateShaderTest *pSVar5;
  ostream *poVar6;
  TestCaseGroup *pTVar7;
  int iVar8;
  VaryingInterpolation qual;
  deUint32 flags;
  string *descPrefix;
  char *pcVar9;
  bool *pbVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  int i;
  VaryingInterpolation qual_00;
  long lVar11;
  uint uVar12;
  VaryingInterpolation VVar13;
  bool bVar14;
  bool bVar15;
  uint local_43c;
  TestCaseGroup *local_438;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  undefined1 local_408 [40];
  string code;
  undefined1 local_3b8 [8];
  VaryingParams VStack_3b0;
  undefined2 local_398;
  undefined1 uStack_396;
  undefined1 uStack_395;
  undefined1 uStack_394;
  undefined2 uStack_393;
  undefined1 uStack_391;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  TestCaseGroup *local_378;
  undefined4 local_370;
  undefined2 uStack_36c;
  undefined1 uStack_36a;
  undefined1 uStack_369;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 local_350;
  undefined2 uStack_34c;
  undefined1 uStack_34a;
  undefined1 uStack_349;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  ostringstream name;
  Random rnd;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen;
  
  local_438 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_438,ctx,"separate_shader","Separate shader tests");
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"pipeline","Pipeline configuration tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  for (uVar12 = 0; uVar12 != 0x20; uVar12 = uVar12 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&seen);
    if ((((uVar12 & 4) == 0) || ((uVar12 & 3) == 0)) || ((uVar12 & 3) == 3)) {
      bVar14 = 0xf < uVar12;
      if (bVar14) {
        std::operator<<((ostream *)&name,"same_");
        std::operator<<((ostream *)&seen,"Identically named ");
      }
      else {
        std::operator<<((ostream *)&name,"different_");
        std::operator<<((ostream *)&seen,"Differently named ");
      }
      bVar15 = (uVar12 & 8) != 0;
      if (bVar15) {
        std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,"uniform_");
        std::operator<<((ostream *)&seen,"uniforms, ");
      }
      else {
        std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,"constant_");
        std::operator<<((ostream *)&seen,"constants, ");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_398 = 0;
      uStack_396 = 0;
      uStack_393 = 0;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 5;
      uStack_380 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_391,(uint7)CONCAT11(bVar14,bVar15) << 0x18));
      params.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params.initSingle = (bool)auVar1[0];
      params.switchVtx = (bool)auVar1[1];
      params.switchFrg = (bool)auVar1[2];
      params.useUniform = (bool)auVar1[3];
      params.useSameName = (bool)auVar1[4];
      params.useCreateHelper = (bool)auVar1[5];
      params.useProgramUniform = (bool)auVar1[6];
      params._7_1_ = auVar1[7];
      params.varyings.count = auVar1._8_4_;
      params.varyings.type = auVar1._12_4_;
      params.varyings.binding = auVar1._16_4_;
      uStack_395 = bVar15;
      uStack_394 = bVar14;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar4,(TestCaseGroup *)&children,&code,
                 (string *)(ulong)(uVar12 & 7),(int)in_R8,(ParamFlags)in_R9,params);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::~string((string *)&children);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"program_uniform","ProgramUniform tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
    if (((uVar12 < 4) || ((uVar12 & 3) == 3)) || ((uVar12 & 3) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&children);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&seen,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&code);
      local_350 = 0x1000000;
      uStack_34c = 0;
      uStack_34a = 1;
      uStack_348 = 0;
      uStack_344 = 0;
      uStack_340 = 0;
      uStack_33c = 5;
      uStack_338 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_349,0x1000001000000));
      params_00.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params_00.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params_00.initSingle = (bool)auVar1[0];
      params_00.switchVtx = (bool)auVar1[1];
      params_00.switchFrg = (bool)auVar1[2];
      params_00.useUniform = (bool)auVar1[3];
      params_00.useSameName = (bool)auVar1[4];
      params_00.useCreateHelper = (bool)auVar1[5];
      params_00.useProgramUniform = (bool)auVar1[6];
      params_00._7_1_ = auVar1[7];
      params_00.varyings.count = auVar1._8_4_;
      params_00.varyings.type = auVar1._12_4_;
      params_00.varyings.binding = auVar1._16_4_;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar4,(TestCaseGroup *)&name,(string *)&seen,
                 (string *)(ulong)uVar12,(int)in_R8,(ParamFlags)in_R9,params_00);
      std::__cxx11::string::~string((string *)&seen);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"create_shader_program","CreateShaderProgram tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  descPrefix = (string *)0x0;
  while (uVar12 = (uint)descPrefix, uVar12 != 8) {
    if (((uVar12 < 4) || ((uVar12 & 3) == 3)) || (((ulong)descPrefix & 3) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&children);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&seen,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&code);
      local_370 = 0;
      uStack_36c = 0x100;
      uStack_36a = 0;
      uStack_368 = 0;
      uStack_364 = 0;
      uStack_360 = 0;
      uStack_35c = 5;
      uStack_358 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_369,0x10000000000));
      params_01.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params_01.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params_01.initSingle = (bool)auVar1[0];
      params_01.switchVtx = (bool)auVar1[1];
      params_01.switchFrg = (bool)auVar1[2];
      params_01.useUniform = (bool)auVar1[3];
      params_01.useSameName = (bool)auVar1[4];
      params_01.useCreateHelper = (bool)auVar1[5];
      params_01.useProgramUniform = (bool)auVar1[6];
      params_01._7_1_ = auVar1[7];
      params_01.varyings.count = auVar1._8_4_;
      params_01.varyings.type = auVar1._12_4_;
      params_01.varyings.binding = auVar1._16_4_;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar4,(TestCaseGroup *)&name,(string *)&seen,descPrefix,
                 (int)in_R8,(ParamFlags)in_R9,params_01);
      std::__cxx11::string::~string((string *)&seen);
      std::__cxx11::string::~string((string *)&name);
    }
    descPrefix = (string *)(ulong)(uVar12 + 1);
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"interface","Shader interface compatibility tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  for (VVar13 = VARYINGINTERPOLATION_SMOOTH; VVar13 != 0x20;
      VVar13 = VVar13 + VARYINGINTERPOLATION_FLAT) {
    local_3b8 = (undefined1  [8])((ulong)local_3b8 & 0xff00000000000000);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&seen);
    qual = VVar13 & VARYINGINTERPOLATION_DEFAULT;
    qual_00 = VVar13 >> 2 & VARYINGINTERPOLATION_DEFAULT;
    VStack_3b0.binding = VVar13 >> 4;
    VStack_3b0._0_8_ = &DAT_100000001;
    VStack_3b0.vtxInterp = qual_00;
    VStack_3b0.frgInterp = qual;
    if ((VVar13 >> 4 & 1) == 0) {
      std::operator<<((ostream *)&name,"same_name");
      pcVar9 = "Varyings have same name, ";
    }
    else {
      std::operator<<((ostream *)&name,"same_location");
      pcVar9 = "Varyings have same location, ";
    }
    std::operator<<((ostream *)&seen,pcVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&children,"vertex",(allocator<char> *)&code);
    anon_unknown_0::describeInterpolation((string *)&children,qual_00,&name,(ostringstream *)&seen);
    std::__cxx11::string::~string((string *)&children);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&children,"fragment",(allocator<char> *)&code);
    anon_unknown_0::describeInterpolation((string *)&children,qual,&name,(ostringstream *)&seen);
    std::__cxx11::string::~string((string *)&children);
    bVar14 = anon_unknown_0::paramsValid((TestParams *)local_3b8);
    if (bVar14) {
      pSVar5 = (SeparateShaderTest *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_408._0_8_ = anon_unknown_0::SeparateShaderTest::testPipelineRendering;
      local_408._8_4_ = 0;
      local_408._12_4_ = TYPE_INVALID;
      anon_unknown_0::SeparateShaderTest::SeparateShaderTest
                (pSVar5,ctx,(string *)&children,&code,4,(TestParams *)local_3b8,0x123f7a2);
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::~string((string *)&children);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  iVar2 = tcu::CommandLine::getBaseSeed(ctx->m_testCtx->m_cmdLine);
  dVar3 = deStringHash("separate_shader.random");
  deRandom_init(&rnd.m_rnd,iVar2 + dVar3);
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seen._M_t._M_impl.super__Rb_tree_header._M_header;
  seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"random","Random pipeline configuration tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  local_378 = pTVar4;
  for (local_43c = 0; local_43c < 0x80; local_43c = local_43c + 1) {
    code._M_dataplus._M_p = (pointer)&code.field_2;
    code._M_string_length = 0;
    local_408._8_4_ = 0;
    local_408._12_4_ = TYPE_LAST;
    local_408._16_4_ = BINDING_LAST;
    local_408._20_4_ = VARYINGINTERPOLATION_LAST;
    local_408._24_4_ = 5;
    code.field_2._M_allocated_capacity = code.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar2 = 0x1000;
    do {
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      deRandom_init((deRandom *)&children,dVar3);
      name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x5e;
      name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ = 2;
      name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_ = 5;
      name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 5;
      uVar12 = 0;
      do {
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_1_ =
             de::Random::getBool((Random *)&children);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_1_ =
             de::Random::getBool((Random *)&children);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._2_1_ =
             de::Random::getBool((Random *)&children);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._3_1_ =
             de::Random::getBool((Random *)&children);
        if ((bool)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._3_1_)
        {
          name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._6_1_ =
               de::Random::getBool((Random *)&children);
        }
        else {
          name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._6_1_ = false;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._5_1_ =
             de::Random::getBool((Random *)&children);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_1_ =
             de::Random::getBool((Random *)&children);
        dVar3 = deRandom_getUint32((deRandom *)&children);
        iVar8 = (int)((ulong)dVar3 % 5);
        name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x5e;
        if (iVar8 == 0) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_ = (iVar8 == 0) + 4;
        name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
             1 << ((char)((ulong)dVar3 % 5) - 1U & 0x1f);
        if (iVar8 == 0) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ = 2;
        name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ =
             name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_;
        bVar14 = anon_unknown_0::paramsValid((TestParams *)&name);
      } while ((!bVar14) && (bVar14 = uVar12 < 0xf, uVar12 = uVar12 + 1, bVar14));
      local_408._0_8_ =
           CONCAT17(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                    _7_1_,CONCAT16(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream._6_1_,
                                   CONCAT15(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                            _vptr_basic_ostream._5_1_,
                                            CONCAT14(name.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._4_1_,
                                                  CONCAT13(name.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._3_1_,
                                                  CONCAT12(name.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._2_1_,
                                                  CONCAT11(name.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._1_1_,
                                                  name.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream._0_1_)))))));
      local_408._8_4_ = name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
      local_408._12_4_ = name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
      local_408._16_4_ = name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_;
      local_408._20_4_ = name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_;
      local_408._24_4_ = name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      pcVar9 = "2";
      if (local_408[0] != '\0') {
        pcVar9 = "1";
      }
      poVar6 = std::operator<<((ostream *)&name,pcVar9);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[1] != '\0') {
        pbVar10 = (bool *)0x17080ef;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[2] != '\0') {
        pbVar10 = (bool *)0x171ea99;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[6] != '\0') {
        pbVar10 = (bool *)0x17f090a;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[3] != '\0') {
        pbVar10 = (bool *)0x1727a24;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[4] != '\0') {
        pbVar10 = (bool *)0x187282b;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      pbVar10 = glcts::fixed_sample_locations_values + 1;
      if (local_408[5] != '\0') {
        pbVar10 = (bool *)0x171ea87;
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      de::toString<int>((string *)&children,(int *)(local_408 + 8));
      poVar6 = std::operator<<(poVar6,(string *)&children);
      pbVar10 = (bool *)0x1881de6;
      if (local_408._16_4_ != BINDING_NAME) {
        if (local_408._16_4_ == BINDING_LOCATION) {
          pbVar10 = (bool *)0x16fb653;
        }
        else {
          pbVar10 = glcts::fixed_sample_locations_values + 1;
          if (local_408._16_4_ == BINDING_LAST) {
            pbVar10 = (bool *)0x166fbee;
          }
        }
      }
      poVar6 = std::operator<<(poVar6,pbVar10);
      if ((ulong)(uint)local_408._20_4_ < 3) {
        pcVar9 = *(char **)(&DAT_01e4ad88 + (ulong)(uint)local_408._20_4_ * 8);
      }
      else {
        pcVar9 = "o";
        if (local_408._20_4_ == VARYINGINTERPOLATION_RANDOM) {
          pcVar9 = "r";
        }
      }
      poVar6 = std::operator<<(poVar6,pcVar9);
      if ((ulong)(uint)local_408._24_4_ < 3) {
        pcVar9 = *(char **)(&DAT_01e4ad88 + (ulong)(uint)local_408._24_4_ * 8);
      }
      else {
        pcVar9 = "o";
        if (local_408._24_4_ == 4) {
          pcVar9 = "r";
        }
      }
      std::operator<<(poVar6,pcVar9);
      std::__cxx11::string::~string((string *)&children);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::__cxx11::string::operator=((string *)&code,(string *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      bVar14 = de::
               contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                         (&seen,&code);
      iVar2 = iVar2 + -1;
    } while (bVar14 && iVar2 != 0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&seen,&code);
    de::toString<unsigned_int>((string *)&name,&local_43c);
    pSVar5 = (SeparateShaderTest *)operator_new(0x180);
    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)anon_unknown_0::SeparateShaderTest::testPipelineRendering;
    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    anon_unknown_0::SeparateShaderTest::SeparateShaderTest
              (pSVar5,ctx,(string *)&name,(string *)&name,4,(TestParams *)local_408,0x123f7a2);
    tcu::TestNode::addChild((TestNode *)local_378,(TestNode *)pSVar5);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&code);
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,ctx,"api","Program pipeline API tests");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  code._M_dataplus._M_p._4_4_ = (uint)((ulong)code._M_dataplus._M_p >> 0x20) & 0xff000000;
  code._M_string_length = 0;
  code.field_2._M_allocated_capacity = 0x500000000;
  code.field_2._8_4_ = 5;
  code._M_dataplus._M_p._0_4_ = 0x1000000;
  pSVar5 = (SeparateShaderTest *)operator_new(0x180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"current_program_priority",(allocator<char> *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&children,"Test priority between current program and pipeline binding",
             (allocator<char> *)&local_43c);
  local_3b8 = (undefined1  [8])anon_unknown_0::SeparateShaderTest::testCurrentProgPriority;
  VStack_3b0.count = 0;
  VStack_3b0.type = TYPE_INVALID;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar5,ctx,(string *)&name,(string *)&children,1,(TestParams *)&code,0x123ffdc);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&children);
  std::__cxx11::string::~string((string *)&name);
  pSVar5 = (SeparateShaderTest *)operator_new(0x180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"active_program_uniform",(allocator<char> *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&children,"Test that glUniform() affects a pipeline\'s active program",
             (allocator<char> *)&local_43c);
  local_3b8 = (undefined1  [8])anon_unknown_0::SeparateShaderTest::testActiveProgramUniform;
  VStack_3b0.count = 0;
  VStack_3b0.type = TYPE_INVALID;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar5,ctx,(string *)&name,(string *)&children,1,(TestParams *)&code,0x1240370);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&children);
  std::__cxx11::string::~string((string *)&name);
  pSVar5 = (SeparateShaderTest *)operator_new(0x180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"pipeline_programs",(allocator<char> *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&children,"Test queries for programs in program pipeline stages",
             (allocator<char> *)&local_43c);
  local_3b8 = (undefined1  [8])anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms;
  VStack_3b0.count = 0;
  VStack_3b0.type = TYPE_INVALID;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar5,ctx,(string *)&name,(string *)&children,1,(TestParams *)&code,0x124082e);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&children);
  std::__cxx11::string::~string((string *)&name);
  pSVar5 = (SeparateShaderTest *)operator_new(0x180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"pipeline_active",(allocator<char> *)local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&children,"Test query for active programs in a program pipeline",
             (allocator<char> *)&local_43c);
  local_3b8 = (undefined1  [8])anon_unknown_0::SeparateShaderTest::testPipelineQueryActive;
  VStack_3b0.count = 0;
  VStack_3b0.type = TYPE_INVALID;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar5,ctx,(string *)&name,(string *)&children,1,(TestParams *)&code,0x12409f8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&children);
  std::__cxx11::string::~string((string *)&name);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,ctx,"validation","Negative program pipeline interface matching");
  tcu::TestNode::addChild((TestNode *)local_438,(TestNode *)pTVar4);
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar7,ctx,"es31","GLSL ES 3.1 pipeline interface matching");
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&name,ctx->m_testCtx,ctx->m_renderCtx,ctx->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            (&children,(ShaderLibrary *)&name,"shaders/es31/separate_shader_validation.test");
  for (lVar11 = 0;
      lVar11 < (int)((ulong)((long)children.
                                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar11 = lVar11 + 1) {
    tcu::TestNode::addChild
              ((TestNode *)pTVar7,
               children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11]);
  }
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&name);
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar7,ctx,"es32","GLSL ES 3.2 pipeline interface matching");
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&name,ctx->m_testCtx,ctx->m_renderCtx,ctx->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            (&children,(ShaderLibrary *)&name,"shaders/es32/separate_shader_validation.test");
  for (lVar11 = 0;
      lVar11 < (int)((ulong)((long)children.
                                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar11 = lVar11 + 1) {
    tcu::TestNode::addChild
              ((TestNode *)pTVar7,
               children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11]);
  }
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&seen._M_t);
  return local_438;
}

Assistant:

TestCaseGroup* createSeparateShaderTests (Context& ctx)
{
	TestParams		defaultParams;
	int				numIterations	= 4;
	TestCaseGroup*	group			=
		new TestCaseGroup(ctx, "separate_shader", "Separate shader tests");

	defaultParams.useUniform			= false;
	defaultParams.initSingle			= false;
	defaultParams.switchVtx				= false;
	defaultParams.switchFrg				= false;
	defaultParams.useCreateHelper		= false;
	defaultParams.useProgramUniform		= false;
	defaultParams.useSameName			= false;
	defaultParams.varyings.count		= 0;
	defaultParams.varyings.type			= glu::TYPE_INVALID;
	defaultParams.varyings.binding		= BINDING_NAME;
	defaultParams.varyings.vtxInterp	= VARYINGINTERPOLATION_LAST;
	defaultParams.varyings.frgInterp	= VARYINGINTERPOLATION_LAST;

	TestCaseGroup* stagesGroup =
		new TestCaseGroup(ctx, "pipeline", "Pipeline configuration tests");
	group->addChild(stagesGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST << 2; ++flags)
	{
		TestParams		params			= defaultParams;
		ostringstream	name;
		ostringstream	desc;

		if (!areCaseParamFlagsValid(ParamFlags(flags & PARAMFLAGS_MASK)))
			continue;

		if (flags & (PARAMFLAGS_LAST << 1))
		{
			params.useSameName = true;
			name << "same_";
			desc << "Identically named ";
		}
		else
		{
			name << "different_";
			desc << "Differently named ";
		}

		if (flags & PARAMFLAGS_LAST)
		{
			params.useUniform = true;
			name << "uniform_";
			desc << "uniforms, ";
		}
		else
		{
			name << "constant_";
			desc << "constants, ";
		}

		addRenderTest(*stagesGroup, name.str(), desc.str(), numIterations,
					  ParamFlags(flags & PARAMFLAGS_MASK), params);
	}

	TestCaseGroup* programUniformGroup =
		new TestCaseGroup(ctx, "program_uniform", "ProgramUniform tests");
	group->addChild(programUniformGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useUniform = true;
		params.useProgramUniform = true;

		addRenderTest(*programUniformGroup, "", "", numIterations, ParamFlags(flags), params);
	}

	TestCaseGroup* createShaderProgramGroup =
		new TestCaseGroup(ctx, "create_shader_program", "CreateShaderProgram tests");
	group->addChild(createShaderProgramGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useCreateHelper = true;

		addRenderTest(*createShaderProgramGroup, "", "", numIterations,
					  ParamFlags(flags), params);
	}

	TestCaseGroup* interfaceGroup =
		new TestCaseGroup(ctx, "interface", "Shader interface compatibility tests");
	group->addChild(interfaceGroup);

	enum
	{
		NUM_INTERPOLATIONS	= VARYINGINTERPOLATION_RANDOM, // VARYINGINTERPOLATION_RANDOM is one after last fully specified interpolation
		INTERFACEFLAGS_LAST = BINDING_LAST * NUM_INTERPOLATIONS * NUM_INTERPOLATIONS
	};

	for (deUint32 flags = 0; flags < INTERFACEFLAGS_LAST; ++flags)
	{
		deUint32				tmpFlags	= flags;
		VaryingInterpolation	frgInterp	= VaryingInterpolation(tmpFlags % NUM_INTERPOLATIONS);
		VaryingInterpolation	vtxInterp	= VaryingInterpolation((tmpFlags /= NUM_INTERPOLATIONS)
																   % NUM_INTERPOLATIONS);
		BindingKind				binding		= BindingKind((tmpFlags /= NUM_INTERPOLATIONS)
														  % BINDING_LAST);
		TestParams				params		= defaultParams;
		ostringstream			name;
		ostringstream			desc;

		params.varyings.count		= 1;
		params.varyings.type		= glu::TYPE_FLOAT;
		params.varyings.binding		= binding;
		params.varyings.vtxInterp	= vtxInterp;
		params.varyings.frgInterp	= frgInterp;

		switch (binding)
		{
			case BINDING_LOCATION:
				name << "same_location";
				desc << "Varyings have same location, ";
				break;
			case BINDING_NAME:
				name << "same_name";
				desc << "Varyings have same name, ";
				break;
			default:
				DE_FATAL("Impossible");
		}

		describeInterpolation("vertex", vtxInterp, name, desc);
		describeInterpolation("fragment", frgInterp, name, desc);

		if (!paramsValid(params))
			continue;

		interfaceGroup->addChild(
			new SeparateShaderTest(ctx, name.str(), desc.str(), numIterations, params,
								   &SeparateShaderTest::testPipelineRendering));
	}

	deUint32		baseSeed	= ctx.getTestContext().getCommandLine().getBaseSeed();
	Random			rnd			(deStringHash("separate_shader.random") + baseSeed);
	set<string>		seen;
	TestCaseGroup*	randomGroup	= new TestCaseGroup(
		ctx, "random", "Random pipeline configuration tests");
	group->addChild(randomGroup);

	for (deUint32 i = 0; i < 128; ++i)
	{
		TestParams		params;
		string			code;
		deUint32		genIterations	= 4096;

		do
		{
			params	= genParams(rnd.getUint32());
			code	= paramsCode(params);
		} while (de::contains(seen, code) && --genIterations > 0);

		seen.insert(code);

		string name = de::toString(i); // Would be code but baseSeed can change

		randomGroup->addChild(new SeparateShaderTest(
								  ctx, name, name, numIterations, params,
								  &SeparateShaderTest::testPipelineRendering));
	}

	TestCaseGroup* apiGroup =
		new TestCaseGroup(ctx, "api", "Program pipeline API tests");
	group->addChild(apiGroup);

	{
		// More or less random parameters. These shouldn't have much effect, so just
		// do a single sample.
		TestParams params = defaultParams;
		params.useUniform = true;
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "current_program_priority",
								  "Test priority between current program and pipeline binding",
								  1, params, &SeparateShaderTest::testCurrentProgPriority));
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "active_program_uniform",
								  "Test that glUniform() affects a pipeline's active program",
								  1, params, &SeparateShaderTest::testActiveProgramUniform));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_programs",
								 "Test queries for programs in program pipeline stages",
								 1, params, &SeparateShaderTest::testPipelineQueryPrograms));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_active",
								 "Test query for active programs in a program pipeline",
								 1, params, &SeparateShaderTest::testPipelineQueryActive));
	}

	TestCaseGroup* interfaceMismatchGroup =
		new TestCaseGroup(ctx, "validation", "Negative program pipeline interface matching");
	group->addChild(interfaceMismatchGroup);

	{
		TestCaseGroup*						es31Group		= new TestCaseGroup(ctx, "es31", "GLSL ES 3.1 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es31Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es31Group);
	}

	{
		TestCaseGroup*						es32Group		= new TestCaseGroup(ctx, "es32", "GLSL ES 3.2 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es32Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es32Group);
	}

	return group;
}